

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::detail::Subcase::Subcase(Subcase *this,String *name,char *file,int line)

{
  vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_> *this_00;
  undefined8 *puVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  size_type sVar6;
  long lVar7;
  long lVar8;
  long extraout_RDX;
  IReporter **curr_rep;
  undefined8 *puVar9;
  Subcase *name_00;
  
  String::copy((String *)this,(EVP_PKEY_CTX *)name,(EVP_PKEY_CTX *)file);
  (this->m_signature).m_file = file;
  (this->m_signature).m_line = line;
  this->m_entered = false;
  lVar2 = g_cs;
  uVar5 = (*(long *)(g_cs + 0x1118) - *(long *)(g_cs + 0x1110)) / 0x28;
  if (uVar5 < (ulong)(long)*(int *)(g_cs + 0x68)) {
    name_00 = this;
    if ((this->m_signature).m_name.field_0.buf[0x17] < '\0') {
      name_00 = (Subcase *)(this->m_signature).m_name.field_0.data.ptr;
    }
    lVar8 = *(long *)(g_cs + 0x10b8);
    bVar4 = *(bool *)(g_cs + 0x6d);
    bVar3 = anon_unknown_14::matchesAny
                      ((char *)name_00,
                       (vector<doctest::String,_std::allocator<doctest::String>_> *)(lVar8 + 0x90),
                       true,bVar4);
    if (!bVar3) {
      return;
    }
    bVar4 = anon_unknown_14::matchesAny
                      ((char *)name_00,
                       (vector<doctest::String,_std::allocator<doctest::String>_> *)(lVar8 + 0xa8),
                       false,bVar4);
    if (bVar4) {
      return;
    }
  }
  if (uVar5 < (ulong)(long)*(int *)(lVar2 + 0x1158)) {
    *(undefined1 *)(lVar2 + 0x115c) = 1;
  }
  else {
    this_00 = (vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_> *)
              (lVar2 + 0x1110);
    std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::push_back
              (this_00,&this->m_signature);
    sVar6 = std::
            set<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
            ::count((set<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
                     *)(lVar2 + 0x1128),this_00);
    if (sVar6 != 0) {
      std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::pop_back
                (this_00);
      return;
    }
    lVar7 = *(long *)(lVar2 + 0x1118) - *(long *)(lVar2 + 0x1110);
    lVar8 = lVar7 % 0x28;
    *(int *)(lVar2 + 0x1158) = (int)(lVar7 / 0x28);
    this->m_entered = true;
    puVar1 = *(undefined8 **)(g_cs + 0x10d8);
    for (puVar9 = *(undefined8 **)(g_cs + 0x10d0); puVar9 != puVar1; puVar9 = puVar9 + 1) {
      (**(code **)(*(long *)*puVar9 + 0x38))((long *)*puVar9,this,lVar8);
      lVar8 = extraout_RDX;
    }
  }
  return;
}

Assistant:

Subcase::Subcase(const String& name, const char* file, int line)
            : m_signature({name, file, line}) {
        auto* s = g_cs;

        // check subcase filters
        if(s->subcasesStack.size() < size_t(s->subcase_filter_levels)) {
            if(!matchesAny(m_signature.m_name.c_str(), s->filters[6], true, s->case_sensitive))
                return;
            if(matchesAny(m_signature.m_name.c_str(), s->filters[7], false, s->case_sensitive))
                return;
        }
        
        // if a Subcase on the same level has already been entered
        if(s->subcasesStack.size() < size_t(s->subcasesCurrentMaxLevel)) {
            s->should_reenter = true;
            return;
        }

        // push the current signature to the stack so we can check if the
        // current stack + the current new subcase have been traversed
        s->subcasesStack.push_back(m_signature);
        if(s->subcasesPassed.count(s->subcasesStack) != 0) {
            // pop - revert to previous stack since we've already passed this
            s->subcasesStack.pop_back();
            return;
        }

        s->subcasesCurrentMaxLevel = s->subcasesStack.size();
        m_entered = true;

        DOCTEST_ITERATE_THROUGH_REPORTERS(subcase_start, m_signature);
    }